

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::MergePartialFromCodedStream
          (GLMClassifier_DoubleArray *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  uint tag;
  ulong uVar6;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00132ef1;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00132ef1:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    tag = (uint)uVar6;
    if ((tag & 0xfffffff8) == 8 && (uVar6 & 0x100000000) != 0) {
      if (tag == 9) {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,10,input,&this->value_);
      }
      else {
        if (tag != 10) goto LAB_00132f39;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&this->value_);
      }
LAB_00132f6a:
      iVar5 = 6;
      if (bVar3 != false) {
        iVar5 = 0;
      }
    }
    else {
LAB_00132f39:
      iVar5 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
        goto LAB_00132f6a;
      }
    }
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool GLMClassifier_DoubleArray::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GLMClassifier.DoubleArray)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated double value = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_value())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(9u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 10u, input, this->mutable_value())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GLMClassifier.DoubleArray)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GLMClassifier.DoubleArray)
  return false;
#undef DO_
}